

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void ParseStructMember(CStructure *st)

{
  CStructure *pCVar1;
  bool bVar2;
  EStructureMembers EVar3;
  int iVar4;
  byte *__s;
  CStructureEntry2 *pCVar5;
  ulong __n;
  EType local_8ac;
  EType local_894;
  char local_878 [8];
  char warnTxt [2048];
  char *local_70;
  char *structName;
  CStructure *s;
  char *pcStack_58;
  int gl;
  char *n;
  char *pp;
  aint local_40;
  aint bytesToAdvance;
  aint fill;
  aint val_1;
  byte *textData;
  EType local_1c;
  aint local_18;
  EType deltaType;
  aint len;
  aint val;
  CStructure *st_local;
  
  bp = lp;
  Relocation::isResultAffected = 0;
  local_1c = OFF;
  _len = st;
  EVar3 = GetStructMemberId(&lp);
  switch(EVar3) {
  case SMEMBALIGN:
    ParseAlignArguments(&lp,&bytesToAdvance,&local_40);
    pCVar1 = _len;
    if (bytesToAdvance == -1) {
      bytesToAdvance = 4;
    }
    if (_len->maxAlignment < bytesToAdvance) {
      _len->maxAlignment = bytesToAdvance;
    }
    pp._4_4_ = (_len->noffset ^ 0xffffffffU) + 1 & bytesToAdvance - 1U;
    if (0 < (int)pp._4_4_) {
      pCVar5 = (CStructureEntry2 *)operator_new(0x28);
      CStructureEntry2::CStructureEntry2(pCVar5,_len->noffset,pp._4_4_,local_40,local_1c,SMEMBBLOCK)
      ;
      CStructure::AddMember(pCVar1,pCVar5);
    }
    break;
  case SMEMBBYTE:
    iVar4 = ParseExpression(&lp,(aint *)&deltaType);
    if (iVar4 == 0) {
      deltaType = OFF;
    }
    check8(deltaType);
    pCVar1 = _len;
    if ((Relocation::isResultAffected & 1) == 0) {
      local_894 = OFF;
    }
    else {
      local_894 = Relocation::deltaType;
    }
    local_1c = local_894;
    pCVar5 = (CStructureEntry2 *)operator_new(0x28);
    CStructureEntry2::CStructureEntry2(pCVar5,_len->noffset,1,deltaType,local_1c,SMEMBBYTE);
    CStructure::AddMember(pCVar1,pCVar5);
    Relocation::resolveRelocationAffected(0x7fffffff,HIGH);
    break;
  case SMEMBWORD:
    iVar4 = ParseExpression(&lp,(aint *)&deltaType);
    if (iVar4 == 0) {
      deltaType = OFF;
    }
    check16(deltaType);
    pCVar1 = _len;
    if ((Relocation::isResultAffected & 1) == 0) {
      local_8ac = OFF;
    }
    else {
      local_8ac = Relocation::deltaType;
    }
    local_1c = local_8ac;
    pCVar5 = (CStructureEntry2 *)operator_new(0x28);
    CStructureEntry2::CStructureEntry2(pCVar5,_len->noffset,2,deltaType,local_1c,SMEMBWORD);
    CStructure::AddMember(pCVar1,pCVar5);
    Relocation::resolveRelocationAffected(0x7fffffff,REGULAR);
    break;
  case SMEMBBLOCK:
    iVar4 = ParseExpression(&lp,&local_18);
    if (iVar4 == 0) {
      local_18 = 1;
      Error("[STRUCT] Expression expected",(char *)0x0,PASS3);
    }
    bVar2 = comma(&lp);
    if (bVar2) {
      iVar4 = ParseExpression(&lp,(aint *)&deltaType);
      if (iVar4 == 0) {
        deltaType = OFF;
        Error("[STRUCT] Expression expected",(char *)0x0,PASS3);
      }
      check8(deltaType);
      deltaType = deltaType & 0xff;
    }
    else {
      deltaType = ~OFF;
    }
    pCVar1 = _len;
    pCVar5 = (CStructureEntry2 *)operator_new(0x28);
    CStructureEntry2::CStructureEntry2(pCVar5,_len->noffset,local_18,deltaType,local_1c,SMEMBBLOCK);
    CStructure::AddMember(pCVar1,pCVar5);
    break;
  case SMEMBDWORD:
    iVar4 = ParseExpression(&lp,(aint *)&deltaType);
    pCVar1 = _len;
    if (iVar4 == 0) {
      deltaType = OFF;
    }
    pCVar5 = (CStructureEntry2 *)operator_new(0x28);
    CStructureEntry2::CStructureEntry2(pCVar5,_len->noffset,4,deltaType,local_1c,SMEMBDWORD);
    CStructure::AddMember(pCVar1,pCVar5);
    break;
  case SMEMBD24:
    iVar4 = ParseExpression(&lp,(aint *)&deltaType);
    if (iVar4 == 0) {
      deltaType = OFF;
    }
    check24(deltaType);
    pCVar1 = _len;
    pCVar5 = (CStructureEntry2 *)operator_new(0x28);
    CStructureEntry2::CStructureEntry2(pCVar5,_len->noffset,3,deltaType,local_1c,SMEMBD24);
    CStructure::AddMember(pCVar1,pCVar5);
    break;
  case SMEMBTEXT:
    iVar4 = ParseExpression(&lp,&local_18);
    if (((iVar4 == 0) || (local_18 < 1)) || (0x2000 < local_18)) {
      Error("[STRUCT] Expression for length of text expected (1..8192)",(char *)0x0,PASS3);
      SkipToEol(&lp);
    }
    else {
      __n = (ulong)local_18;
      __s = (byte *)operator_new__(__n);
      memset(__s,0,__n);
      _fill = __s;
      if (__s == (byte *)0x0) {
        ErrorOOM();
      }
      bVar2 = comma(&lp);
      if (bVar2) {
        GetStructText(&lp,local_18,_fill,(byte *)0x0);
      }
      else {
        iVar4 = SkipBlanks(&lp);
        if (iVar4 == 0) {
          Error("[STRUCT] Comma expected",lp,SUPPRESS);
        }
      }
      pCVar1 = _len;
      pCVar5 = (CStructureEntry2 *)operator_new(0x28);
      CStructureEntry2::CStructureEntry2(pCVar5,_len->noffset,local_18,_fill);
      CStructure::AddMember(pCVar1,pCVar5);
    }
    break;
  default:
    n = lp;
    s._4_4_ = 0;
    SkipBlanks(&n);
    if (*n == '@') {
      n = n + 1;
      s._4_4_ = 1;
    }
    pcStack_58 = GetID(&n);
    if ((pcStack_58 != (char *)0x0) &&
       (structName = (char *)CStructureTable::zoek(&StructureTable,pcStack_58,s._4_4_),
       (CStructure *)structName != (CStructure *)0x0)) {
      local_70 = _len->naam;
      iVar4 = cmphstr(&local_70,pcStack_58,false);
      if (iVar4 == 0) {
        if ((*(int *)(structName + 0x14) != 0) &&
           (((_len->noffset ^ 0xffffffffU) + 1 & *(int *)(structName + 0x14) - 1U) != 0)) {
          snprintf(local_878,0x800,
                   "Struct %s did use ALIGN %d in definition, but here it is misaligned by %d bytes"
                   ,*(undefined8 *)structName,(ulong)*(uint *)(structName + 0x14),
                   (ulong)((_len->noffset ^ 0xffffffffU) + 1 & *(int *)(structName + 0x14) - 1U));
          Warning(local_878,(char *)0x0,W_PASS3);
        }
        lp = n;
        CStructure::CopyLabels(_len,(CStructure *)structName);
        CStructure::CopyMembers(_len,(CStructure *)structName,&lp);
      }
      else {
        Error("[STRUCT] Can\'t include itself",(char *)0x0,PASS3);
        SkipToEol(&n);
        lp = n;
      }
    }
  }
  Relocation::checkAndWarn(false);
  return;
}

Assistant:

void ParseStructMember(CStructure* st) {
	aint val, len;
	bp = lp;
	Relocation::isResultAffected = false;
	Relocation::EType deltaType = Relocation::OFF;
	switch (GetStructMemberId(lp)) {
	case SMEMBBLOCK:
		if (!ParseExpression(lp, len)) {
			len = 1;
			Error("[STRUCT] Expression expected");
		}
		if (comma(lp)) {
			if (!ParseExpression(lp, val)) {
				val = 0;
				Error("[STRUCT] Expression expected");
			}
			check8(val);
			val &= 255;
		} else {
			val = -1;
		}
		st->AddMember(new CStructureEntry2(st->noffset, len, val, deltaType, SMEMBBLOCK));
		break;
	case SMEMBBYTE:
		if (!ParseExpression(lp, val)) val = 0;
		check8(val);
		deltaType = Relocation::isResultAffected ? Relocation::deltaType : Relocation::OFF;
		st->AddMember(new CStructureEntry2(st->noffset, 1, val, deltaType, SMEMBBYTE));
		Relocation::resolveRelocationAffected(INT_MAX, Relocation::HIGH);	// clear flags + warn when can't be relocated
		break;
	case SMEMBWORD:
		if (!ParseExpression(lp, val)) val = 0;
		check16(val);
		deltaType = Relocation::isResultAffected ? Relocation::deltaType : Relocation::OFF;
		st->AddMember(new CStructureEntry2(st->noffset, 2, val, deltaType, SMEMBWORD));
		Relocation::resolveRelocationAffected(INT_MAX);	// clear flags + warn when can't be relocated
		break;
	case SMEMBD24:
		if (!ParseExpression(lp, val)) val = 0;
		check24(val);
		st->AddMember(new CStructureEntry2(st->noffset, 3, val, deltaType, SMEMBD24));
		break;
	case SMEMBDWORD:
		if (!ParseExpression(lp, val)) val = 0;
		st->AddMember(new CStructureEntry2(st->noffset, 4, val, deltaType, SMEMBDWORD));
		break;
	case SMEMBTEXT:
		{
			if (!ParseExpression(lp, len) || len < 1 || CStructureEntry2::TEXT_MAX_SIZE < len) {
				Error("[STRUCT] Expression for length of text expected (1..8192)");
				SkipToEol(lp);
				break;
			}
			byte* textData = new byte[len]();	// zero-initialized for stable binary results
			if (nullptr == textData) ErrorOOM();
			if (comma(lp)) {		// if comma then init data array explicitly
				GetStructText(lp, len, textData);
			} else if (SkipBlanks(lp)) {
				// if empty without comma, init with the zeroed values
			} else {
				Error("[STRUCT] Comma expected", lp, SUPPRESS);	// syntax error
			}
			st->AddMember(new CStructureEntry2(st->noffset, len, textData));
		}
		break;
	case SMEMBALIGN:
	{
		aint val, fill;
		ParseAlignArguments(lp, val, fill);
		if (-1 == val) val = 4;
		if (st->maxAlignment < val) st->maxAlignment = val;	// update structure "max alignment"
		aint bytesToAdvance = (~st->noffset + 1) & (val - 1);
		if (bytesToAdvance < 1) break;		// already aligned, nothing to do
		// create alignment block
		st->AddMember(new CStructureEntry2(st->noffset, bytesToAdvance, fill, deltaType, SMEMBBLOCK));
		break;
	}
	default:
		char* pp = lp,* n;
		int gl = 0;
		CStructure* s;
		SkipBlanks(pp);
		if (*pp == '@') {
			++pp;
			gl = 1;
		}
		if ((n = GetID(pp)) && (s = StructureTable.zoek(n, gl))) {
			char* structName = st->naam;	// need copy of pointer so cmphstr can advance it in case of match
			if (cmphstr(structName, n)) {
				Error("[STRUCT] Can't include itself", NULL);
				SkipToEol(pp);
				lp = pp;
				break;
			}
			if (s->maxAlignment && ((~st->noffset + 1) & (s->maxAlignment - 1))) {
				// Inserted structure did use ALIGN in definition and it is misaligned here
				char warnTxt[LINEMAX];
				SPRINTF3(warnTxt, LINEMAX,
						 "Struct %s did use ALIGN %d in definition, but here it is misaligned by %d bytes",
						 s->naam, s->maxAlignment, ((~st->noffset + 1) & (s->maxAlignment - 1)));
				Warning(warnTxt);
			}
			lp = pp;
			st->CopyLabels(s);
			st->CopyMembers(s, lp);
		}
		break;
	}
	Relocation::checkAndWarn();
}